

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptTextureType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  bool bVar2;
  TType *pTVar3;
  bool bVar4;
  bool bVar5;
  EHlslTokenClass EVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  HlslParseContext *pHVar12;
  _func_int **pp_Var13;
  byte bVar14;
  TSampler sampler;
  TIntermTyped *msCount;
  TType txType;
  TIntermNode *nodeList;
  TSampler local_17c;
  TLayoutFormat local_178;
  uint local_174;
  TType *local_170;
  TIntermTyped *local_168;
  TType local_160;
  TType local_c8;
  
  local_170 = type;
  EVar6 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  local_174 = 0x600;
  switch(EVar6) {
  case EHTokTexture1d:
    local_174 = 0x100;
    break;
  case EHTokTexture1darray:
    local_174 = 0x100;
    goto LAB_003a6103;
  case EHTokTexture2d:
    local_174 = 0x200;
    break;
  case EHTokTexture2darray:
    local_174 = 0x200;
    goto LAB_003a6103;
  case EHTokTexture3d:
    local_174 = 0x300;
    break;
  case EHTokTextureCube:
    local_174 = 0x400;
    break;
  case EHTokTextureCubearray:
    local_174 = 0x400;
LAB_003a6103:
    uVar10 = 0x10000;
    bVar2 = false;
    bVar14 = 0;
    goto LAB_003a613c;
  case EHTokTexture2DMS:
    local_174 = 0x200;
    bVar2 = false;
    bVar14 = 1;
    goto LAB_003a60f9;
  case EHTokTexture2DMSarray:
    local_174 = 0x200;
    uVar10 = 0x10000;
    bVar2 = false;
    bVar14 = 1;
    goto LAB_003a613c;
  case EHTokRWTexture1d:
    local_174 = 0x100;
    goto LAB_003a60f0;
  case EHTokRWTexture1darray:
    local_174 = 0x100;
    goto LAB_003a6118;
  case EHTokRWTexture2d:
    local_174 = 0x200;
    goto LAB_003a60f0;
  case EHTokRWTexture2darray:
    local_174 = 0x200;
LAB_003a6118:
    uVar10 = 0x10000;
    bVar2 = true;
    bVar14 = 0;
    goto LAB_003a613c;
  case EHTokRWTexture3d:
    local_174 = 0x300;
LAB_003a60f0:
    bVar14 = 0;
    bVar2 = true;
    goto LAB_003a60f9;
  case EHTokRWBuffer:
    bVar14 = 0;
    bVar2 = true;
    bVar1 = true;
    uVar10 = 0;
    bVar5 = true;
    goto LAB_003a613f;
  default:
    bVar5 = true;
    bVar2 = false;
    bVar1 = false;
    bVar14 = 0;
    uVar10 = 0;
    if (EVar6 != EHTokBuffer) {
      return false;
    }
    goto LAB_003a613f;
  }
  bVar2 = false;
  bVar14 = 0;
LAB_003a60f9:
  uVar10 = 0;
LAB_003a613c:
  bVar1 = true;
  bVar5 = false;
LAB_003a613f:
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  TType::TType(&local_160,EbtFloat,EvqUniform,4,0,0,false);
  local_168 = (TIntermTyped *)0x0;
  bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar4) {
    local_c8._vptr_TType = (_func_int **)0x0;
    bVar4 = acceptType(this,&local_160,(TIntermNode **)&local_c8);
    if (bVar4) {
      if ((local_160._8_1_ < 0x10) && ((0x8302U >> (local_160._8_4_ & 0x1f) & 1) != 0)) {
        if (bVar5 && (local_160._8_4_ & 0xf000) != 0) {
          if (((uint)local_160._8_4_ >> 0x10 & 0xf) * ((uint)local_160._8_4_ >> 0xc & 0xf) < 5) {
            pcVar11 = "Unimplemented";
            pcVar9 = "matrix type in buffer";
          }
          else {
            pcVar11 = "Expected";
            pcVar9 = "components < 4 in matrix buffer type";
          }
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,pcVar11,pcVar9,"");
          return false;
        }
        bVar4 = TType::isScalar(&local_160);
        if (((bVar4) || ((local_160._8_4_ & 0x100e00) != 0)) || ((local_160._8_4_ & 0xff) - 0xf < 2)
           ) {
          if ((bVar14 != 0) &&
             (bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma),
             bVar4)) {
            bVar4 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
            if (!bVar4) {
              pHVar12 = this->parseContext;
              pp_Var13 = (pHVar12->super_TParseContextBase).super_TParseVersions.
                         _vptr_TParseVersions;
              pcVar11 = "Expected";
              pcVar9 = "multisample count";
              goto LAB_003a64e7;
            }
            bVar4 = acceptLiteral(this,&local_168);
            if (!bVar4) {
              return false;
            }
          }
          bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
          if (bVar4) goto LAB_003a6316;
          pHVar12 = this->parseContext;
          pp_Var13 = (pHVar12->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar11 = "Expected";
          pcVar9 = "right angle bracket";
        }
        else {
          pHVar12 = this->parseContext;
          pp_Var13 = (pHVar12->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar11 = "Expected";
          pcVar9 = "scalar, vector, or struct type";
        }
      }
      else {
        pHVar12 = this->parseContext;
        pp_Var13 = (pHVar12->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar11 = "Unimplemented";
        pcVar9 = "basic type in texture";
      }
    }
    else {
      pHVar12 = this->parseContext;
      pp_Var13 = (pHVar12->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar11 = "Expected";
      pcVar9 = "scalar or vector type";
    }
  }
  else if (bVar14 == 0) {
    if (!bVar2) {
LAB_003a6316:
      if ((bool)(bVar2 | bVar5)) {
        local_178 = HlslParseContext::getLayoutFromTxType
                              (this->parseContext,&(this->super_HlslTokenStream).token.loc,
                               &local_160);
      }
      else {
        local_178 = ElfNone;
      }
      uVar8 = local_160._8_4_;
      if ((local_160._8_4_ & 0xff) - 0xf < 2) {
        iVar7 = (*local_160._vptr_TType[0x25])();
        if ((char)iVar7 == '\0') {
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
        }
        uVar8 = (*(((local_160.field_13.structure)->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[7])();
      }
      if (bVar5 && !bVar2) {
        local_17c = (TSampler)
                    (((uint)local_17c & 0x80000000 | (uint)(byte)local_160._8_1_) + uVar10 +
                    0x1f100600);
      }
      else {
        uVar10 = (uint)bVar14 << 0x12 | uVar10;
        if (bVar2) {
          local_17c = (TSampler)
                      (uVar10 | local_174 | uVar8 & 0xff | (uint)local_17c & 0x80000000 | 0x1f080000
                      );
        }
        else {
          local_17c = (TSampler)
                      (uVar10 | local_174 | uVar8 & 0xff | (uint)local_17c & 0x80000000 | 0x1f000000
                      );
        }
      }
      bVar5 = HlslParseContext::setTextureReturnType
                        (this->parseContext,&local_17c,&local_160,
                         &(this->super_HlslTokenStream).token.loc);
      if (!bVar5) {
        return bVar5;
      }
      if (!bVar1) {
        local_17c = (TSampler)((uint)local_17c & 0xffefffff);
      }
      TType::TType(&local_c8,&local_17c,EvqUniform,(TArraySizes *)0x0);
      pTVar3 = local_170;
      TType::shallowCopy(local_170,&local_c8);
      iVar7 = (*pTVar3->_vptr_TType[10])(pTVar3);
      *(char *)(CONCAT44(extraout_var,iVar7) + 0x2c) = (char)local_178;
      return bVar5;
    }
    pHVar12 = this->parseContext;
    pp_Var13 = (pHVar12->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar11 = "Expected";
    pcVar9 = "type for RWTexture/RWBuffer";
  }
  else {
    pHVar12 = this->parseContext;
    pp_Var13 = (pHVar12->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar11 = "Expected";
    pcVar9 = "texture type for multisample";
  }
LAB_003a64e7:
  (*pp_Var13[0x2d])(pHVar12,&(this->super_HlslTokenStream).token,pcVar11,pcVar9,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptTextureType(TType& type)
{
    const EHlslTokenClass textureType = peek();

    TSamplerDim dim = EsdNone;
    bool array = false;
    bool ms    = false;
    bool image = false;
    bool combined = true;

    switch (textureType) {
    case EHTokBuffer:            dim = EsdBuffer; combined = false;    break;
    case EHTokTexture1d:         dim = Esd1D;                          break;
    case EHTokTexture1darray:    dim = Esd1D; array = true;            break;
    case EHTokTexture2d:         dim = Esd2D;                          break;
    case EHTokTexture2darray:    dim = Esd2D; array = true;            break;
    case EHTokTexture3d:         dim = Esd3D;                          break;
    case EHTokTextureCube:       dim = EsdCube;                        break;
    case EHTokTextureCubearray:  dim = EsdCube; array = true;          break;
    case EHTokTexture2DMS:       dim = Esd2D; ms = true;               break;
    case EHTokTexture2DMSarray:  dim = Esd2D; array = true; ms = true; break;
    case EHTokRWBuffer:          dim = EsdBuffer; image=true;          break;
    case EHTokRWTexture1d:       dim = Esd1D; array=false; image=true; break;
    case EHTokRWTexture1darray:  dim = Esd1D; array=true;  image=true; break;
    case EHTokRWTexture2d:       dim = Esd2D; array=false; image=true; break;
    case EHTokRWTexture2darray:  dim = Esd2D; array=true;  image=true; break;
    case EHTokRWTexture3d:       dim = Esd3D; array=false; image=true; break;
    default:
        return false;  // not a texture declaration
    }

    advanceToken();  // consume the texture object keyword

    TType txType(EbtFloat, EvqUniform, 4); // default type is float4

    TIntermTyped* msCount = nullptr;

    // texture type: required for multisample types and RWBuffer/RWTextures!
    if (acceptTokenClass(EHTokLeftAngle)) {
        if (! acceptType(txType)) {
            expected("scalar or vector type");
            return false;
        }

        const TBasicType basicRetType = txType.getBasicType() ;

        switch (basicRetType) {
        case EbtFloat:
        case EbtUint:
        case EbtInt:
        case EbtStruct:
            break;
        default:
            unimplemented("basic type in texture");
            return false;
        }

        // Buffers can handle small mats if they fit in 4 components
        if (dim == EsdBuffer && txType.isMatrix()) {
            if ((txType.getMatrixCols() * txType.getMatrixRows()) > 4) {
                expected("components < 4 in matrix buffer type");
                return false;
            }

            // TODO: except we don't handle it yet...
            unimplemented("matrix type in buffer");
            return false;
        }

        if (!txType.isScalar() && !txType.isVector() && !txType.isStruct()) {
            expected("scalar, vector, or struct type");
            return false;
        }

        if (ms && acceptTokenClass(EHTokComma)) {
            // read sample count for multisample types, if given
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("multisample count");
                return false;
            }

            if (! acceptLiteral(msCount))  // should never fail, since we just found an integer
                return false;
        }

        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    } else if (ms) {
        expected("texture type for multisample");
        return false;
    } else if (image) {
        expected("type for RWTexture/RWBuffer");
        return false;
    }

    TArraySizes* arraySizes = nullptr;
    const bool shadow = false; // declared on the sampler

    TSampler sampler;
    TLayoutFormat format = ElfNone;

    // Buffer, RWBuffer and RWTexture (images) require a TLayoutFormat.  We handle only a limit set.
    if (image || dim == EsdBuffer)
        format = parseContext.getLayoutFromTxType(token.loc, txType);

    const TBasicType txBasicType = txType.isStruct() ? (*txType.getStruct())[0].type->getBasicType()
        : txType.getBasicType();

    // Non-image Buffers are combined
    if (dim == EsdBuffer && !image) {
        sampler.set(txType.getBasicType(), dim, array);
    } else {
        // DX10 textures are separated.  TODO: DX9.
        if (image) {
            sampler.setImage(txBasicType, dim, array, shadow, ms);
        } else {
            sampler.setTexture(txBasicType, dim, array, shadow, ms);
        }
    }

    // Remember the declared return type.  Function returns false on error.
    if (!parseContext.setTextureReturnType(sampler, txType, token.loc))
        return false;

    // Force uncombined, if necessary
    if (!combined)
        sampler.combined = false;

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));
    type.getQualifier().layoutFormat = format;

    return true;
}